

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMCasts.hpp
# Opt level: O0

DOMChildNode * xercesc_4_0::castToChildImpl(DOMNode *p)

{
  long lVar1;
  DOMException *this;
  DOMChildNode *pDVar2;
  long *local_38;
  HasDOMChildImpl *pE;
  DOMNode *p_local;
  
  if (p == (DOMNode *)0x0) {
    local_38 = (long *)0x0;
  }
  else {
    local_38 = (long *)__dynamic_cast(p,&DOMNode::typeinfo,&HasDOMChildImpl::typeinfo,
                                      0xfffffffffffffffe);
  }
  if (local_38 != (long *)0x0) {
    lVar1 = (**(code **)(*local_38 + 0x10))();
    if (lVar1 != 0) {
      pDVar2 = (DOMChildNode *)(**(code **)(*local_38 + 0x10))();
      return pDVar2;
    }
  }
  this = (DOMException *)__cxa_allocate_exception(0x28);
  DOMException::DOMException(this,0xb,0,XMLPlatformUtils::fgMemoryManager);
  __cxa_throw(this,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

static inline DOMChildNode *castToChildImpl(DOMNode *p) {
    HasDOMChildImpl *pE = dynamic_cast<HasDOMChildImpl*>(p);
    if (!pE || !pE->getChildNodeImpl()) {
        throw DOMException(DOMException::INVALID_STATE_ERR, 0, XMLPlatformUtils::fgMemoryManager);
    }
    return pE->getChildNodeImpl();
}